

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

pair<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>,_unsigned_long>
* __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::FindHelper
          (pair<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>,_unsigned_long>
           *__return_storage_ptr__,InnerMap *this,MapKey *k,TreeIterator *it)

{
  void **ppvVar1;
  _Rb_tree<google::protobuf::MapKey_*,_google::protobuf::MapKey_*,_std::_Identity<google::protobuf::MapKey_*>,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
  *this_00;
  bool bVar2;
  size_t sVar3;
  iterator iVar4;
  ulong uVar5;
  Node *this_01;
  MapKey *key;
  MapKey *local_38;
  
  sVar3 = hash<google::protobuf::MapKey>::operator()((hash<google::protobuf::MapKey> *)this,k);
  ppvVar1 = this->table_;
  uVar5 = this->num_buckets_ - 1 & sVar3 + this->seed_;
  this_01 = (Node *)ppvVar1[uVar5];
  if (this_01 != (Node *)0x0) {
    if (this_01 == (Node *)ppvVar1[uVar5 ^ 1]) {
      uVar5 = uVar5 & 0xfffffffffffffffe;
      this_00 = (_Rb_tree<google::protobuf::MapKey_*,_google::protobuf::MapKey_*,_std::_Identity<google::protobuf::MapKey_*>,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
                 *)ppvVar1[uVar5];
      local_38 = k;
      iVar4 = std::
              _Rb_tree<google::protobuf::MapKey_*,_google::protobuf::MapKey_*,_std::_Identity<google::protobuf::MapKey_*>,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
              ::find(this_00,&local_38);
      if ((_Rb_tree_header *)iVar4._M_node != &(this_00->_M_impl).super__Rb_tree_header) {
        if (it != (TreeIterator *)0x0) {
          it->_M_node = iVar4._M_node;
        }
        (__return_storage_ptr__->first).node_ = *(Node **)(iVar4._M_node + 1);
LAB_00296461:
        (__return_storage_ptr__->first).m_ = this;
        (__return_storage_ptr__->first).bucket_index_ = uVar5;
        goto LAB_00296469;
      }
    }
    else {
      do {
        bVar2 = MapKey::operator==((MapKey *)this_01,k);
        if (bVar2) {
          (__return_storage_ptr__->first).node_ = this_01;
          goto LAB_00296461;
        }
        this_01 = this_01->next;
      } while (this_01 != (Node *)0x0);
    }
  }
  (__return_storage_ptr__->first).node_ = (Node *)0x0;
  (__return_storage_ptr__->first).m_ = (InnerMap *)0x0;
  (__return_storage_ptr__->first).bucket_index_ = 0;
LAB_00296469:
  __return_storage_ptr__->second = uVar5;
  return __return_storage_ptr__;
}

Assistant:

std::pair<const_iterator, size_type> FindHelper(const Key& k,
                                                    TreeIterator* it) const {
      size_type b = BucketNumber(k);
      if (TableEntryIsNonEmptyList(b)) {
        Node* node = static_cast<Node*>(table_[b]);
        do {
          if (IsMatch(*KeyPtrFromNodePtr(node), k)) {
            return std::make_pair(const_iterator(node, this, b), b);
          } else {
            node = node->next;
          }
        } while (node != NULL);
      } else if (TableEntryIsTree(b)) {
        GOOGLE_DCHECK_EQ(table_[b], table_[b ^ 1]);
        b &= ~static_cast<size_t>(1);
        Tree* tree = static_cast<Tree*>(table_[b]);
        Key* key = const_cast<Key*>(&k);
        typename Tree::iterator tree_it = tree->find(key);
        if (tree_it != tree->end()) {
          if (it != NULL) *it = tree_it;
          return std::make_pair(const_iterator(tree_it, this, b), b);
        }
      }
      return std::make_pair(end(), b);
    }